

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::writeLPF(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,ostream *p_output,NameSet *p_rnames,NameSet *p_cnames,DIdxSet *p_intvars,
          bool writeZeroObjective)

{
  undefined8 *puVar1;
  uint *puVar2;
  pointer pnVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  size_t sVar10;
  ostream *poVar11;
  Item *pIVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  char *pcVar16;
  cpp_dec_float<50U,_int,_void> *p_lhs;
  undefined7 in_register_00000089;
  long lVar17;
  int iVar18;
  double dVar19;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar20;
  long lVar21;
  long in_FS_OFFSET;
  char name_2 [16];
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  svec;
  char name_1 [16];
  char name [16];
  cpp_dec_float<50U,_int,_void> local_178;
  undefined1 local_138 [8];
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  SStack_130;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNStack_120;
  uint local_118 [2];
  int local_110;
  bool local_10c;
  fpclass_type local_108;
  cpp_dec_float<50U,_int,_void> local_f8;
  IdxSet *local_c0;
  double local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  NameSet *local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  cpp_dec_float<50U,_int,_void> local_88;
  char local_48 [24];
  
  local_98 = (double)CONCAT44(local_98._4_4_,(int)CONCAT71(in_register_00000089,writeZeroObjective))
  ;
  lVar17 = *(long *)p_output;
  *(undefined8 *)(p_output + *(long *)(lVar17 + -0x18) + 8) = 0x10;
  lVar17 = *(long *)(lVar17 + -0x18);
  *(uint *)(p_output + lVar17 + 0x18) = *(uint *)(p_output + lVar17 + 0x18) & 0xfffffefb | 0x100;
  dVar19 = (double)(long)this->thesense;
  pcVar16 = "Maximize\n";
  if (dVar19 == -NAN) {
    pcVar16 = "Minimize\n";
  }
  local_c0 = &p_intvars->super_IdxSet;
  local_a8 = p_rnames;
  std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar16,9);
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"  obj: ",7);
  iVar8 = (int)((ulong)((long)(this->
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).object.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->
                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).object.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249;
  SStack_130.m_elem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  SStack_130.memsize = 0;
  SStack_130.memused = 0;
  local_138 = (undefined1  [8])&PTR__DSVectorBase_006adc40;
  pNStack_120 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x0;
  iVar18 = 2;
  if (0 < iVar8) {
    iVar18 = iVar8;
  }
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)local_138,iVar18);
  SStack_130._8_8_ = SStack_130._8_8_ & 0xffffffff;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setMax((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)local_138,
           (int)((ulong)((long)(this->
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).object.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).object.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249);
  SStack_130._8_8_ = SStack_130._8_8_ & 0xffffffff;
  uVar14 = (int)((long)(this->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x49249249;
  local_b8 = dVar19;
  if ((int)uVar14 < 1) {
    iVar18 = 0;
  }
  else {
    uVar15 = (ulong)(uVar14 & 0x7fffffff);
    iVar18 = 0;
    pNVar20 = SStack_130.m_elem;
    lVar17 = uVar15 * 0x38;
    do {
      pnVar3 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(int *)((long)&pnVar3[-1].m_backend.data + lVar17 + 0x30) == 2) {
LAB_00222bda:
        pNVar20->idx = (int)uVar15 + -1;
        pnVar3 = (this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((pNVar20->val).m_backend.data._M_elems + 8) =
             *(undefined8 *)((long)&pnVar3[-1].m_backend.data + lVar17 + 0x20);
        puVar1 = (undefined8 *)((long)&pnVar3[-1].m_backend.data + lVar17);
        uVar4 = *puVar1;
        uVar6 = puVar1[1];
        puVar1 = (undefined8 *)((long)&pnVar3[-1].m_backend.data + lVar17 + 0x10);
        uVar7 = puVar1[1];
        *(undefined8 *)((pNVar20->val).m_backend.data._M_elems + 4) = *puVar1;
        *(undefined8 *)((pNVar20->val).m_backend.data._M_elems + 6) = uVar7;
        *(undefined8 *)(pNVar20->val).m_backend.data._M_elems = uVar4;
        *(undefined8 *)((pNVar20->val).m_backend.data._M_elems + 2) = uVar6;
        (pNVar20->val).m_backend.exp = *(int *)((long)&pnVar3[-1].m_backend.data + lVar17 + 0x28);
        (pNVar20->val).m_backend.neg = *(bool *)((long)&pnVar3[-1].m_backend.data + lVar17 + 0x2c);
        uVar4 = *(undefined8 *)((long)&pnVar3[-1].m_backend.data + lVar17 + 0x30);
        (pNVar20->val).m_backend.fpclass = (int)uVar4;
        (pNVar20->val).m_backend.prec_elem = (int)((ulong)uVar4 >> 0x20);
        pNVar20 = pNVar20 + 1;
        iVar18 = iVar18 + 1;
      }
      else {
        local_178.fpclass = cpp_dec_float_finite;
        local_178.prec_elem = 10;
        local_178.data._M_elems[0] = 0;
        local_178.data._M_elems[1] = 0;
        local_178.data._M_elems[2] = 0;
        local_178.data._M_elems[3] = 0;
        local_178.data._M_elems[4] = 0;
        local_178.data._M_elems[5] = 0;
        local_178.data._M_elems._24_5_ = 0;
        local_178.data._M_elems[7]._1_3_ = 0;
        local_178.data._M_elems._32_5_ = 0;
        local_178.data._M_elems[9]._1_3_ = 0;
        local_178.exp = 0;
        local_178.neg = false;
        iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          ((cpp_dec_float<50U,_int,_void> *)
                           ((long)&pnVar3[-1].m_backend.data + lVar17),&local_178);
        if (iVar8 != 0) goto LAB_00222bda;
      }
      bVar5 = 1 < (long)uVar15;
      uVar15 = uVar15 - 1;
      lVar17 = lVar17 + -0x38;
    } while (bVar5);
  }
  SStack_130.memused = iVar18;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_178,(longlong)local_b8,(type *)0x0);
  if (SStack_130.memused != 0) {
    pNVar20 = SStack_130.m_elem;
    uVar14 = SStack_130.memused;
    do {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                ((cpp_dec_float<50U,_int,_void> *)pNVar20,&local_178);
      pNVar20 = pNVar20 + 1;
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
  LPFwriteSVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (this,p_output,p_cnames,&SStack_130,local_98._0_1_);
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"\n",1);
  local_138 = (undefined1  [8])&PTR__DSVectorBase_006adc40;
  if (pNStack_120 !=
      (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0) {
    free(pNStack_120);
    pNStack_120 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"Subject To\n",0xb);
  iVar18 = (int)p_output;
  if (0 < (this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    local_98 = *(double *)(in_FS_OFFSET + -8);
    uStack_90 = 0;
    local_b8 = -local_98;
    uStack_b0 = 0;
    uStack_ac = 0x80000000;
    lVar17 = 6;
    lVar21 = 0;
    do {
      pnVar3 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar17 * 8 + -0x10);
      local_178.data._M_elems._32_5_ = SUB85(uVar4,0);
      local_178.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar17 * 8 + -0x30);
      local_178.data._M_elems._0_8_ = *(undefined8 *)puVar2;
      local_178.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar17 * 8 + -0x20);
      local_178.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      uVar4 = *(undefined8 *)(puVar2 + 2);
      local_178.data._M_elems._24_5_ = SUB85(uVar4,0);
      local_178.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_178.exp = *(int *)((long)&(pnVar3->m_backend).data + lVar17 * 8 + -8);
      local_178.neg = *(bool *)((long)&(pnVar3->m_backend).data + lVar17 * 8 + -4);
      local_178._48_8_ = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar17 * 8);
      pnVar3 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_118 = *(uint (*) [2])((long)&(pnVar3->m_backend).data + lVar17 * 8 + -0x10);
      puVar1 = (undefined8 *)((long)&(pnVar3->m_backend).data + lVar17 * 8 + -0x30);
      local_138 = (undefined1  [8])*puVar1;
      SStack_130.m_elem =
           (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)puVar1[1];
      puVar1 = (undefined8 *)((long)&(pnVar3->m_backend).data + lVar17 * 8 + -0x20);
      SStack_130._8_8_ = *puVar1;
      pNStack_120 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)puVar1[1];
      local_110 = *(int *)((long)&(pnVar3->m_backend).data + lVar17 * 8 + -8);
      local_10c = *(bool *)((long)&(pnVar3->m_backend).data + lVar17 * 8 + -4);
      _local_108 = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar17 * 8);
      ::soplex::infinity::__tls_init();
      local_f8.fpclass = cpp_dec_float_finite;
      local_f8.prec_elem = 10;
      local_f8.data._M_elems[0] = 0;
      local_f8.data._M_elems[1] = 0;
      local_f8.data._M_elems[2] = 0;
      local_f8.data._M_elems[3] = 0;
      local_f8.data._M_elems[4] = 0;
      local_f8.data._M_elems[5] = 0;
      local_f8.data._M_elems._24_5_ = 0;
      local_f8.data._M_elems[7]._1_3_ = 0;
      local_f8.data._M_elems._32_5_ = 0;
      local_f8.data._M_elems[9]._1_3_ = 0;
      local_f8.exp = 0;
      local_f8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_f8,local_b8);
      iVar8 = (int)lVar21;
      if (((local_178.fpclass == cpp_dec_float_NaN) || (local_f8.fpclass == cpp_dec_float_NaN)) ||
         (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_178,&local_f8), iVar9 < 1)) {
LAB_00222ea8:
        std::__ostream_insert<char,std::char_traits<char>>(p_output," ",1);
        pcVar16 = LPFgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (this,iVar8,local_a8,local_48,iVar8);
        if (pcVar16 == (char *)0x0) {
          std::ios::clear(iVar18 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
        }
        else {
          sVar10 = strlen(pcVar16);
          std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar16,sVar10);
        }
        std::__ostream_insert<char,std::char_traits<char>>(p_output," : ",3);
        pIVar12 = (this->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.theitem +
                  (this->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey[lVar21].idx;
        p_lhs = &local_178;
      }
      else {
        ::soplex::infinity::__tls_init();
        local_88.fpclass = cpp_dec_float_finite;
        local_88.prec_elem = 10;
        local_88.data._M_elems[0] = 0;
        local_88.data._M_elems[1] = 0;
        local_88.data._M_elems[2] = 0;
        local_88.data._M_elems[3] = 0;
        local_88.data._M_elems[4] = 0;
        local_88.data._M_elems[5] = 0;
        local_88.data._M_elems._24_5_ = 0;
        local_88.data._M_elems[7]._1_3_ = 0;
        local_88.data._M_elems._32_5_ = 0;
        local_88._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_88,local_98);
        if ((((local_108 == cpp_dec_float_NaN) || (local_88.fpclass == cpp_dec_float_NaN)) ||
            (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_138,&local_88), -1 < iVar9))
           || (((local_178.fpclass != cpp_dec_float_NaN && (local_108 != cpp_dec_float_NaN)) &&
               (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_178,(cpp_dec_float<50U,_int,_void> *)local_138),
               iVar9 == 0)))) goto LAB_00222ea8;
        std::__ostream_insert<char,std::char_traits<char>>(p_output," ",1);
        pcVar16 = LPFgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (this,iVar8,local_a8,local_48,iVar8);
        if (pcVar16 == (char *)0x0) {
          std::ios::clear(iVar18 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
        }
        else {
          sVar10 = strlen(pcVar16);
          std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar16,sVar10);
        }
        std::__ostream_insert<char,std::char_traits<char>>(p_output,"_1 : ",5);
        iVar9 = (this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey[lVar21].idx;
        pIVar12 = (this->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.theitem;
        ::soplex::infinity::__tls_init();
        local_f8.fpclass = cpp_dec_float_finite;
        local_f8.prec_elem = 10;
        local_f8.data._M_elems[0] = 0;
        local_f8.data._M_elems[1] = 0;
        local_f8.data._M_elems[2] = 0;
        local_f8.data._M_elems[3] = 0;
        local_f8.data._M_elems[4] = 0;
        local_f8.data._M_elems[5] = 0;
        local_f8.data._M_elems._24_5_ = 0;
        local_f8.data._M_elems[7]._1_3_ = 0;
        local_f8.data._M_elems._32_5_ = 0;
        local_f8.data._M_elems[9]._1_3_ = 0;
        local_f8.exp = 0;
        local_f8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_f8,local_98);
        LPFwriteRow<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (this,p_output,p_cnames,
                   (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)(pIVar12 + iVar9),
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_178,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_f8);
        std::__ostream_insert<char,std::char_traits<char>>(p_output," ",1);
        pcVar16 = LPFgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (this,iVar8,local_a8,local_48,iVar8);
        if (pcVar16 == (char *)0x0) {
          std::ios::clear(iVar18 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
        }
        else {
          sVar10 = strlen(pcVar16);
          std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar16,sVar10);
        }
        std::__ostream_insert<char,std::char_traits<char>>(p_output,"_2 : ",5);
        pIVar12 = (this->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.theitem +
                  (this->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey[lVar21].idx;
        ::soplex::infinity::__tls_init();
        local_f8.fpclass = cpp_dec_float_finite;
        local_f8.prec_elem = 10;
        local_f8.data._M_elems[0] = 0;
        local_f8.data._M_elems[1] = 0;
        local_f8.data._M_elems[2] = 0;
        local_f8.data._M_elems[3] = 0;
        local_f8.data._M_elems[4] = 0;
        local_f8.data._M_elems[5] = 0;
        local_f8.data._M_elems._24_5_ = 0;
        local_f8.data._M_elems[7]._1_3_ = 0;
        local_f8.data._M_elems._32_5_ = 0;
        local_f8.data._M_elems[9]._1_3_ = 0;
        local_f8.exp = 0;
        local_f8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_f8,local_b8);
        p_lhs = &local_f8;
      }
      LPFwriteRow<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (this,p_output,p_cnames,
                 (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)pIVar12,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)p_lhs,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)local_138);
      lVar21 = lVar21 + 1;
      lVar17 = lVar17 + 7;
    } while (lVar21 < (this->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"Bounds\n",7);
  if (0 < (this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    local_a8 = *(NameSet **)(in_FS_OFFSET + -8);
    uStack_a0 = 0;
    local_b8 = -(double)local_a8;
    uStack_b0 = 0;
    uStack_ac = 0x80000000;
    lVar17 = 0x30;
    lVar21 = 0;
    do {
      pnVar3 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_118 = *(uint (*) [2])((long)&(pnVar3->m_backend).data + lVar17 + -0x10);
      puVar1 = (undefined8 *)((long)&(pnVar3->m_backend).data + lVar17 + -0x30);
      local_138 = (undefined1  [8])*puVar1;
      SStack_130.m_elem =
           (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)puVar1[1];
      puVar1 = (undefined8 *)((long)&(pnVar3->m_backend).data + lVar17 + -0x20);
      SStack_130._8_8_ = *puVar1;
      pNStack_120 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)puVar1[1];
      local_110 = *(int *)((long)&(pnVar3->m_backend).data + lVar17 + -8);
      local_10c = *(bool *)((long)&(pnVar3->m_backend).data + lVar17 + -4);
      _local_108 = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar17);
      pnVar3 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar17 + -0x10);
      local_f8.data._M_elems._32_5_ = SUB85(uVar4,0);
      local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar17 + -0x30);
      local_f8.data._M_elems._0_8_ = *(undefined8 *)puVar2;
      local_f8.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar17 + -0x20);
      local_f8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      uVar4 = *(undefined8 *)(puVar2 + 2);
      local_f8.data._M_elems._24_5_ = SUB85(uVar4,0);
      local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_f8.exp = *(int *)((long)&(pnVar3->m_backend).data + lVar17 + -8);
      local_f8.neg = *(bool *)((long)&(pnVar3->m_backend).data + lVar17 + -4);
      local_f8._48_8_ = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar17);
      iVar8 = (int)lVar21;
      if ((((fpclass_type)_local_108 == cpp_dec_float_NaN) ||
          (local_f8.fpclass == cpp_dec_float_NaN)) ||
         (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            ((cpp_dec_float<50U,_int,_void> *)local_138,&local_f8), iVar9 != 0)) {
        ::soplex::infinity::__tls_init();
        local_178.fpclass = cpp_dec_float_finite;
        local_178.prec_elem = 10;
        local_178.data._M_elems[0] = 0;
        local_178.data._M_elems[1] = 0;
        local_178.data._M_elems[2] = 0;
        local_178.data._M_elems[3] = 0;
        local_178.data._M_elems[4] = 0;
        local_178.data._M_elems[5] = 0;
        local_178.data._M_elems._24_5_ = 0;
        local_178.data._M_elems[7]._1_3_ = 0;
        local_178.data._M_elems._32_5_ = 0;
        local_178.data._M_elems[9]._1_3_ = 0;
        local_178.exp = 0;
        local_178.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_178,local_b8);
        if (((local_108 == cpp_dec_float_NaN) || (local_178.fpclass == cpp_dec_float_NaN)) ||
           (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              ((cpp_dec_float<50U,_int,_void> *)local_138,&local_178), iVar9 < 1)) {
          ::soplex::infinity::__tls_init();
          local_178.fpclass = cpp_dec_float_finite;
          local_178.prec_elem = 10;
          local_178.data._M_elems[0] = 0;
          local_178.data._M_elems[1] = 0;
          local_178.data._M_elems[2] = 0;
          local_178.data._M_elems[3] = 0;
          local_178.data._M_elems[4] = 0;
          local_178.data._M_elems[5] = 0;
          local_178.data._M_elems._24_5_ = 0;
          local_178.data._M_elems[7]._1_3_ = 0;
          local_178.data._M_elems._32_5_ = 0;
          local_178.data._M_elems[9]._1_3_ = 0;
          local_178.exp = 0;
          local_178.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_178,(double)local_a8);
          if (((local_f8.fpclass != cpp_dec_float_NaN) && (local_178.fpclass != cpp_dec_float_NaN))
             && (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_f8,&local_178), iVar9 < 0)) {
            lVar13 = 0xb;
            pcVar16 = "   -Inf <= ";
LAB_00223572:
            std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar16,lVar13);
            pcVar16 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (this,iVar8,p_cnames,(char *)&local_88);
            if (pcVar16 == (char *)0x0) {
              std::ios::clear(iVar18 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
            }
            else {
              sVar10 = strlen(pcVar16);
              std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar16,sVar10);
            }
            lVar13 = 4;
            pcVar16 = " <= ";
            goto LAB_00223708;
          }
          std::__ostream_insert<char,std::char_traits<char>>(p_output,"  ",2);
          pcVar16 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (this,iVar8,p_cnames,(char *)&local_88);
          if (pcVar16 == (char *)0x0) {
            std::ios::clear(iVar18 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
          }
          else {
            sVar10 = strlen(pcVar16);
            std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar16,sVar10);
          }
          std::__ostream_insert<char,std::char_traits<char>>(p_output," free\n",6);
        }
        else {
          ::soplex::infinity::__tls_init();
          local_178.fpclass = cpp_dec_float_finite;
          local_178.prec_elem = 10;
          local_178.data._M_elems[0] = 0;
          local_178.data._M_elems[1] = 0;
          local_178.data._M_elems[2] = 0;
          local_178.data._M_elems[3] = 0;
          local_178.data._M_elems[4] = 0;
          local_178.data._M_elems[5] = 0;
          local_178.data._M_elems._24_5_ = 0;
          local_178.data._M_elems[7]._1_3_ = 0;
          local_178.data._M_elems._32_5_ = 0;
          local_178.data._M_elems[9]._1_3_ = 0;
          local_178.exp = 0;
          local_178.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_178,(double)local_a8);
          if (((local_f8.fpclass != cpp_dec_float_NaN) && (local_178.fpclass != cpp_dec_float_NaN))
             && (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_f8,&local_178), iVar9 < 0)) {
            if (local_108 != cpp_dec_float_NaN) {
              local_178.fpclass = cpp_dec_float_finite;
              local_178.prec_elem = 10;
              local_178.data._M_elems[0] = 0;
              local_178.data._M_elems[1] = 0;
              local_178.data._M_elems[2] = 0;
              local_178.data._M_elems[3] = 0;
              local_178.data._M_elems[4] = 0;
              local_178.data._M_elems[5] = 0;
              local_178.data._M_elems._24_5_ = 0;
              local_178.data._M_elems[7]._1_3_ = 0;
              local_178.data._M_elems._32_5_ = 0;
              local_178.data._M_elems[9]._1_3_ = 0;
              local_178.exp = 0;
              local_178.neg = false;
              iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                ((cpp_dec_float<50U,_int,_void> *)local_138,&local_178);
              if (iVar9 == 0) {
                lVar13 = 2;
                pcVar16 = "  ";
                goto LAB_00223572;
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>(p_output,"  ",2);
            poVar11 = boost::multiprecision::operator<<
                                (p_output,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)local_138);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," <= ",4);
            pcVar16 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (this,iVar8,p_cnames,(char *)&local_88);
            if (pcVar16 == (char *)0x0) {
              std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
            }
            else {
              sVar10 = strlen(pcVar16);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar16,sVar10);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," <= ",4);
            goto LAB_00223710;
          }
          if (local_108 != cpp_dec_float_NaN) {
            local_178.fpclass = cpp_dec_float_finite;
            local_178.prec_elem = 10;
            local_178.data._M_elems[0] = 0;
            local_178.data._M_elems[1] = 0;
            local_178.data._M_elems[2] = 0;
            local_178.data._M_elems[3] = 0;
            local_178.data._M_elems[4] = 0;
            local_178.data._M_elems[5] = 0;
            local_178.data._M_elems._24_5_ = 0;
            local_178.data._M_elems[7]._1_3_ = 0;
            local_178.data._M_elems._32_5_ = 0;
            local_178.data._M_elems[9]._1_3_ = 0;
            local_178.exp = 0;
            local_178.neg = false;
            iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              ((cpp_dec_float<50U,_int,_void> *)local_138,&local_178);
            if (iVar9 == 0) goto LAB_00223737;
          }
          std::__ostream_insert<char,std::char_traits<char>>(p_output,"  ",2);
          poVar11 = boost::multiprecision::operator<<
                              (p_output,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)local_138);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," <= ",4);
          pcVar16 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (this,iVar8,p_cnames,(char *)&local_88);
          if (pcVar16 == (char *)0x0) {
            std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
          }
          else {
            sVar10 = strlen(pcVar16);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar16,sVar10);
          }
          local_178.data._M_elems[0]._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_178,1);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(p_output,"  ",2);
        pcVar16 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (this,iVar8,p_cnames,(char *)&local_88);
        if (pcVar16 == (char *)0x0) {
          std::ios::clear(iVar18 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
        }
        else {
          sVar10 = strlen(pcVar16);
          std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar16,sVar10);
        }
        lVar13 = 3;
        pcVar16 = " = ";
LAB_00223708:
        std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar16,lVar13);
        poVar11 = p_output;
LAB_00223710:
        poVar11 = boost::multiprecision::operator<<
                            (poVar11,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_f8);
        local_178.data._M_elems[0]._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_178,1);
      }
LAB_00223737:
      lVar21 = lVar21 + 1;
      lVar17 = lVar17 + 0x38;
    } while (lVar21 < (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  if (((local_c0 != (IdxSet *)0x0) && (0 < local_c0->num)) &&
     (std::__ostream_insert<char,std::char_traits<char>>(p_output,"Generals\n",9),
     0 < (this->
         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .set.thenum)) {
    iVar8 = 0;
    do {
      iVar9 = IdxSet::pos(local_c0,iVar8);
      if (-1 < iVar9) {
        std::__ostream_insert<char,std::char_traits<char>>(p_output,"  ",2);
        pcVar16 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (this,iVar8,p_cnames,(char *)&local_178);
        if (pcVar16 == (char *)0x0) {
          std::ios::clear(iVar18 + (int)*(undefined8 *)(*(long *)p_output + -0x18));
        }
        else {
          sVar10 = strlen(pcVar16);
          std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar16,sVar10);
        }
        std::__ostream_insert<char,std::char_traits<char>>(p_output,"\n",1);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < (this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum);
  }
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"End",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + (char)p_output);
  std::ostream::put((char)p_output);
  std::ostream::flush();
  return;
}

Assistant:

inline
void SPxLPBase<R>::writeLPF(
   std::ostream&  p_output,          ///< output stream
   const NameSet* p_rnames,          ///< row names
   const NameSet* p_cnames,          ///< column names
   const DIdxSet* p_intvars,         ///< integer variables
   const bool     writeZeroObjective ///< write zero objective coefficients
) const
{
   SPxOut::setScientific(p_output, 16);

   LPFwriteObjective(*this, p_output, p_cnames, writeZeroObjective);
   LPFwriteRows(*this, p_output, p_rnames, p_cnames);
   LPFwriteBounds(*this, p_output, p_cnames);
   LPFwriteGenerals(*this, p_output, p_cnames, p_intvars);

   p_output << "End" << std::endl;
}